

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bootstrap.c
# Opt level: O2

int symbolBareCmp(uint8_t *left,int leftsize,uint8_t *right,int rightsize)

{
  byte *pbVar1;
  byte *pbVar2;
  int32_t minsize;
  uint uVar3;
  ulong uVar4;
  ulong uVar5;
  
  uVar3 = leftsize;
  if (rightsize < leftsize) {
    uVar3 = rightsize;
  }
  uVar5 = 0;
  uVar4 = (ulong)uVar3;
  if ((int)uVar3 < 1) {
    uVar4 = uVar5;
  }
  do {
    if (uVar4 == uVar5) {
      return leftsize - rightsize;
    }
    pbVar1 = left + uVar5;
    pbVar2 = right + uVar5;
    uVar5 = uVar5 + 1;
  } while (*pbVar1 == *pbVar2);
  return -(uint)(*pbVar1 < *pbVar2) | 1;
}

Assistant:

int symbolBareCmp(const uint8_t *left, int leftsize, const uint8_t *right, int rightsize)
{
    int32_t minsize = leftsize;
    int32_t i;

    if (rightsize < minsize)
        minsize = rightsize;
    for (i = 0; i < minsize; i++) {
        if (left[i] != right[i]) {
            if (left[i] < right[i]) {
                return -1;
            } else {
                return 1;
            }
        }
    }
    return (int)leftsize - (int)rightsize;
}